

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_list.cpp
# Opt level: O2

ColumnDefinition * __thiscall duckdb::ColumnList::GetColumn(ColumnList *this,LogicalIndex logical)

{
  long lVar1;
  const_reference pvVar2;
  InternalException *this_00;
  allocator local_39;
  string local_38;
  
  lVar1 = (long)(this->columns).
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->columns).
                super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (logical.index < (ulong)(lVar1 / 0xd8)) {
    pvVar2 = vector<duckdb::ColumnDefinition,_true>::get<true>(&this->columns,logical.index);
    return pvVar2;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10,logical.index,lVar1 % 0xd8);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Logical column index %lld out of range",&local_39);
  InternalException::InternalException<unsigned_long>(this_00,&local_38,logical.index);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

const ColumnDefinition &ColumnList::GetColumn(LogicalIndex logical) const {
	if (logical.index >= columns.size()) {
		throw InternalException("Logical column index %lld out of range", logical.index);
	}
	return columns[logical.index];
}